

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS
ref_recon_extrapolate_zeroth(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  long lVar1;
  int iVar2;
  REF_ADJ pRVar3;
  REF_ADJ_ITEM pRVar4;
  REF_INT *pRVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  REF_BOOL *pRVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  int iVar17;
  REF_NODE ref_node;
  double dVar18;
  REF_INT remain;
  REF_EDGE ref_edge;
  int local_7c;
  REF_EDGE local_78;
  REF_GRID local_70;
  ulong local_68;
  REF_EDGE local_60;
  long local_58;
  ulong local_50;
  REF_NODE local_48;
  REF_GLOB *local_40;
  REF_DBL *local_38;
  
  ref_node = ref_grid->node;
  uVar6 = ref_edge_create(&local_60,ref_grid);
  if (uVar6 == 0) {
    local_70 = ref_grid;
    uVar6 = ref_node_ghost_int(ref_node,replace,ldim);
    if (uVar6 == 0) {
      uVar6 = ref_node_ghost_dbl(ref_node,recon,ldim);
      if (uVar6 == 0) {
        local_7c = 1;
        uVar11 = (ulong)(uint)ldim;
        local_58 = uVar11 * 4;
        uVar10 = 0;
        local_68 = uVar11;
        local_48 = ref_node;
        local_38 = recon;
        while( true ) {
          iVar13 = ref_node->max;
          if (0 < iVar13) {
            local_40 = ref_node->global;
            local_78 = local_60;
            uVar6 = 0;
            lVar9 = 0;
            do {
              if ((-1 < local_40[lVar9]) &&
                 (ref_node->ref_mpi->id == ref_node->part[lVar9] && 0 < ldim)) {
                lVar14 = lVar9 * uVar11;
                uVar15 = 0;
                do {
                  lVar1 = uVar15 + lVar14;
                  if (replace[lVar1] != 0) {
                    pRVar3 = local_60->adj;
                    iVar13 = pRVar3->nnode;
                    if ((lVar9 < iVar13) && (iVar7 = pRVar3->first[lVar9], iVar7 != -1)) {
                      iVar17 = 0;
                      do {
                        iVar2 = pRVar3->item[iVar7].ref;
                        iVar17 = iVar17 + (uint)(replace[(int)((local_60->e2n[(long)iVar2 * 2] +
                                                                uVar6 + local_60->e2n[iVar2 * 2 + 1]
                                                               ) * ldim + (int)uVar15)] == 0);
                        iVar7 = pRVar3->item[iVar7].next;
                      } while (iVar7 != -1);
                      uVar11 = local_68;
                      recon = local_38;
                      if (iVar17 != 0) {
                        local_38[lVar1] = 0.0;
                        dVar18 = 0.0;
                        if ((lVar9 < iVar13) && (iVar13 = pRVar3->first[lVar9], iVar13 != -1)) {
                          pRVar4 = pRVar3->item;
                          pRVar5 = local_60->e2n;
                          do {
                            iVar7 = pRVar4[iVar13].ref;
                            iVar7 = (pRVar5[(long)iVar7 * 2] + uVar6 + pRVar5[iVar7 * 2 + 1]) * ldim
                                    + (int)uVar15;
                            if (replace[iVar7] == 0) {
                              dVar18 = dVar18 + local_38[iVar7];
                              local_38[lVar1] = dVar18;
                            }
                            iVar13 = pRVar4[iVar13].next;
                          } while (iVar13 != -1);
                        }
                        local_38[lVar1] = dVar18 / (double)iVar17;
                        replace[lVar1] = 0;
                      }
                    }
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 != uVar11);
                iVar13 = local_48->max;
                ref_node = local_48;
              }
              lVar14 = lVar9 + 1;
              uVar6 = ~(uint)lVar9;
              lVar9 = lVar14;
            } while (lVar14 < iVar13);
          }
          local_50 = uVar10;
          uVar6 = ref_node_ghost_int(ref_node,replace,ldim);
          if (uVar6 != 0) break;
          uVar6 = ref_node_ghost_dbl(ref_node,recon,ldim);
          if (uVar6 != 0) {
            pcVar16 = "update ghosts";
            uVar8 = 0x463;
            goto LAB_001eac0e;
          }
          local_7c = 0;
          if (0 < (long)ref_node->max) {
            uVar10 = 0;
            iVar13 = 0;
            pRVar12 = replace;
            do {
              if ((-1 < ref_node->global[uVar10]) &&
                 (ref_node->ref_mpi->id == ref_node->part[uVar10] && 0 < ldim)) {
                uVar15 = 0;
                do {
                  if (pRVar12[uVar15] != 0) {
                    iVar13 = iVar13 + 1;
                    local_7c = iVar13;
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar11 != uVar15);
              }
              uVar10 = uVar10 + 1;
              pRVar12 = (REF_BOOL *)((long)pRVar12 + local_58);
            } while (uVar10 < (ulong)(long)ref_node->max);
          }
          uVar6 = ref_mpi_allsum(local_70->mpi,&local_7c,1,1);
          if (uVar6 != 0) {
            pcVar16 = "sum updates";
            uVar8 = 0x46d;
            goto LAB_001eac0e;
          }
          if ((local_7c == 0) || (uVar6 = (int)local_50 + 1, uVar10 = (ulong)uVar6, uVar6 == 10)) {
            ref_edge_free(local_60);
            if (local_7c < 1) {
              return 0;
            }
            if (local_70->mpi->id != 0) {
              return 0;
            }
            printf(" %d remain\n");
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x476,"ref_recon_extrapolate_zeroth","untouched boundary nodes remain");
            return 0;
          }
        }
        pcVar16 = "update ghosts";
        uVar8 = 0x462;
      }
      else {
        pcVar16 = "update ghosts";
        uVar8 = 0x442;
      }
    }
    else {
      pcVar16 = "update ghosts";
      uVar8 = 0x441;
    }
  }
  else {
    pcVar16 = "edges";
    uVar8 = 0x43f;
  }
LAB_001eac0e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar8,
         "ref_recon_extrapolate_zeroth",(ulong)uVar6,pcVar16);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_zeroth(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, item, edge;
  REF_EDGE ref_edge;
  REF_INT i, neighbor, nint;
  REF_INT pass, remain;

  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  remain = 1;
  for (pass = 0; pass < 10; pass++) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) {
            nint = 0;
            each_edge_having_node(ref_edge, node, item, edge) {
              neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                         ref_edge_e2n(ref_edge, 1, edge) - node;
              if (!replace[i + ldim * neighbor]) nint++;
            }
            if (0 < nint) {
              recon[i + ldim * node] = 0.0;
              each_edge_having_node(ref_edge, node, item, edge) {
                neighbor = ref_edge_e2n(ref_edge, 0, edge) +
                           ref_edge_e2n(ref_edge, 1, edge) - node;
                if (!replace[i + ldim * neighbor]) {
                  recon[i + ldim * node] += recon[i + ldim * neighbor];
                }
              }
              /* use Euclidean average, these are derivatives */
              recon[i + ldim * node] /= (REF_DBL)nint;
              replace[i + ldim * node] = REF_FALSE;
            }
          }
        }
      }
    }

    RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
    RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");
    remain = 0;
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        for (i = 0; i < ldim; i++) {
          if (replace[i + ldim * node]) remain++;
        }
      }
    }
    RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), &remain, 1, REF_INT_TYPE),
        "sum updates");

    if (0 == remain) break;
  }

  ref_edge_free(ref_edge);

  if (0 < remain && ref_mpi_once(ref_grid_mpi(ref_grid))) {
    printf(" %d remain\n", remain);
    REF_WHERE("untouched boundary nodes remain");
  }

  return REF_SUCCESS;
}